

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# distinct_aggregate_optimizer.cpp
# Opt level: O1

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::DistinctWindowedOptimizer::Apply
          (DistinctWindowedOptimizer *this,LogicalOperator *op,
          vector<std::reference_wrapper<duckdb::Expression>,_true> *bindings,bool *changes_made,
          bool is_root)

{
  reference pvVar1;
  BoundWindowExpression *wexpr;
  ClientContext *context;
  undefined7 in_register_00000081;
  
  context = (ClientContext *)0x0;
  pvVar1 = vector<std::reference_wrapper<duckdb::Expression>,_true>::operator[]
                     ((vector<std::reference_wrapper<duckdb::Expression>,_true> *)changes_made,0);
  wexpr = BaseExpression::Cast<duckdb::BoundWindowExpression>
                    (&pvVar1->_M_data->super_BaseExpression);
  Apply(this,context,wexpr,(bool *)CONCAT71(in_register_00000081,is_root));
  return (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)
         (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>_>)this;
}

Assistant:

unique_ptr<Expression> DistinctWindowedOptimizer::Apply(LogicalOperator &op, vector<reference<Expression>> &bindings,
                                                        bool &changes_made, bool is_root) {
	auto &wexpr = bindings[0].get().Cast<BoundWindowExpression>();
	return Apply(rewriter.context, wexpr, changes_made);
}